

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugi.cpp
# Opt level: O0

NULLCArray NULLCPugiXML::description(xml_parse_result *desc)

{
  NULLCArray NVar1;
  char *__s;
  size_t sVar2;
  undefined1 local_38 [8];
  xml_parse_result res;
  xml_parse_result *desc_local;
  NULLCArray ret;
  
  res._16_8_ = desc;
  pugi::xml_parse_result::xml_parse_result((xml_parse_result *)local_38);
  local_38._0_4_ = *(undefined4 *)res._16_8_;
  res._0_8_ = SEXT48(*(int *)(res._16_8_ + 4));
  res.offset._0_4_ = *(undefined4 *)(res._16_8_ + 8);
  __s = pugi::xml_parse_result::description((xml_parse_result *)local_38);
  sVar2 = strlen(__s);
  NVar1.len = (int)sVar2 + 1;
  NVar1.ptr = __s;
  return NVar1;
}

Assistant:

NULLCArray description(xml_parse_result* desc)
	{
		NULLCArray ret;
		pugi::xml_parse_result res;
		res.status = (pugi::xml_parse_status)desc->status;
		res.offset = desc->offset;
		res.encoding = (pugi::xml_encoding)desc->encoding;
		ret.ptr = (char*)res.description();
		ret.len = (unsigned)strlen(ret.ptr) + 1;
		return ret;
	}